

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_setup_conn(connectdata *conn,_Bool *protocol_done)

{
  Curl_easy *data_00;
  char *pcVar1;
  curltime cVar2;
  undefined4 uStack_74;
  undefined4 uStack_44;
  Curl_easy *data;
  CURLcode result;
  _Bool *protocol_done_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data_00 = conn->data;
  Curl_pgrsTime(data_00,TIMER_NAMELOOKUP);
  if ((conn->handler->flags & 0x10) == 0) {
    *protocol_done = false;
    *(ulong *)&(conn->bits).field_0x4 = *(ulong *)&(conn->bits).field_0x4 & 0xffffffffffffffef;
    if ((data_00->set).str[0x26] != (char *)0x0) {
      (*Curl_cfree)((data_00->state).aptr.uagent);
      (data_00->state).aptr.uagent = (char *)0x0;
      pcVar1 = curl_maprintf("User-Agent: %s\r\n",(data_00->set).str[0x26]);
      (data_00->state).aptr.uagent = pcVar1;
      if ((data_00->state).aptr.uagent == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    (data_00->req).headerbytecount = 0;
    (data_00->state).crlf_conversions = 0;
    cVar2 = Curl_now();
    (conn->now).tv_sec = cVar2.tv_sec;
    *(ulong *)&(conn->now).tv_usec = CONCAT44(uStack_44,cVar2.tv_usec);
    if (conn->sock[0] == -1) {
      (conn->bits).tcpconnect[0] = false;
      data._4_4_ = Curl_connecthost(conn,conn->dns_entry);
      if (data._4_4_ != CURLE_OK) {
        return data._4_4_;
      }
    }
    else {
      Curl_pgrsTime(data_00,TIMER_CONNECT);
      if (((conn->ssl[0].field_0x10 & 1) != 0) || ((conn->handler->protocol & 0x30) != 0)) {
        Curl_pgrsTime(data_00,TIMER_APPCONNECT);
      }
      (conn->bits).tcpconnect[0] = true;
      *protocol_done = true;
      Curl_updateconninfo(conn,conn->sock[0]);
      Curl_verboseconnect(conn);
    }
    cVar2 = Curl_now();
    (conn->now).tv_sec = cVar2.tv_sec;
    *(ulong *)&(conn->now).tv_usec = CONCAT44(uStack_74,cVar2.tv_usec);
    conn_local._4_4_ = data._4_4_;
  }
  else {
    *protocol_done = true;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_setup_conn(struct connectdata *conn,
                         bool *protocol_done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  Curl_pgrsTime(data, TIMER_NAMELOOKUP);

  if(conn->handler->flags & PROTOPT_NONETWORK) {
    /* nothing to setup when not using a network */
    *protocol_done = TRUE;
    return result;
  }
  *protocol_done = FALSE; /* default to not done */

#ifndef CURL_DISABLE_PROXY
  /* set proxy_connect_closed to false unconditionally already here since it
     is used strictly to provide extra information to a parent function in the
     case of proxy CONNECT failures and we must make sure we don't have it
     lingering set from a previous invoke */
  conn->bits.proxy_connect_closed = FALSE;
#endif
  /*
   * Set user-agent. Used for HTTP, but since we can attempt to tunnel
   * basically anything through a http proxy we can't limit this based on
   * protocol.
   */
  if(data->set.str[STRING_USERAGENT]) {
    Curl_safefree(data->state.aptr.uagent);
    data->state.aptr.uagent =
      aprintf("User-Agent: %s\r\n", data->set.str[STRING_USERAGENT]);
    if(!data->state.aptr.uagent)
      return CURLE_OUT_OF_MEMORY;
  }

  data->req.headerbytecount = 0;

#ifdef CURL_DO_LINEEND_CONV
  data->state.crlf_conversions = 0; /* reset CRLF conversion counter */
#endif /* CURL_DO_LINEEND_CONV */

  /* set start time here for timeout purposes in the connect procedure, it
     is later set again for the progress meter purpose */
  conn->now = Curl_now();

  if(CURL_SOCKET_BAD == conn->sock[FIRSTSOCKET]) {
    conn->bits.tcpconnect[FIRSTSOCKET] = FALSE;
    result = Curl_connecthost(conn, conn->dns_entry);
    if(result)
      return result;
  }
  else {
    Curl_pgrsTime(data, TIMER_CONNECT);    /* we're connected already */
    if(conn->ssl[FIRSTSOCKET].use ||
       (conn->handler->protocol & PROTO_FAMILY_SSH))
      Curl_pgrsTime(data, TIMER_APPCONNECT); /* we're connected already */
    conn->bits.tcpconnect[FIRSTSOCKET] = TRUE;
    *protocol_done = TRUE;
    Curl_updateconninfo(conn, conn->sock[FIRSTSOCKET]);
    Curl_verboseconnect(conn);
  }

  conn->now = Curl_now(); /* time this *after* the connect is done, we set
                             this here perhaps a second time */
  return result;
}